

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O0

int __thiscall QPDFOutlineObjectHelper::getCount(QPDFOutlineObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_a1;
  string local_a0 [32];
  QPDFObjectHelper local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [28];
  int count;
  QPDFOutlineObjectHelper *this_local;
  
  local_28._20_4_ = 0;
  unique0x10000298 = (element_type *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Count",&local_49);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  if (bVar1) {
    QPDFObjectHelper::oh(&local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Count",&local_a1);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)
               &local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (string *)&local_80);
    local_28._20_4_ =
         QPDFObjectHandle::getIntValueAsInt
                   ((QPDFObjectHandle *)
                    &local_80.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_80);
  }
  return local_28._20_4_;
}

Assistant:

int
QPDFOutlineObjectHelper::getCount()
{
    int count = 0;
    if (oh().hasKey("/Count")) {
        count = oh().getKey("/Count").getIntValueAsInt();
    }
    return count;
}